

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

char * __thiscall
sentencepiece::NBestSentencePieceText::_InternalParse
          (NBestSentencePieceText *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  SentencePieceText *msg;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar2;
  uint local_44;
  ParseContext *pPStack_40;
  uint32 tag;
  ParseContext *ctx_local;
  char *ptr_local;
  NBestSentencePieceText *this_local;
  string *local_20;
  InternalMetadata *local_18;
  InternalMetadata *local_10;
  
  pPStack_40 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_40,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,&local_44,0)
      ;
      tag_00 = local_44;
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      if ((local_44 >> 3 != 1) || ((local_44 & 0xff) != 10)) break;
      ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.factory + 7);
      do {
        this_00 = pPStack_40;
        ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
        msg = _internal_add_nbests(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::
                    ParseMessage<sentencepiece::SentencePieceText>(this_00,msg,(char *)ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                          (&pPStack_40->super_EpsCopyInputStream,(char *)ctx_local);
      } while ((bVar1) &&
              (bVar1 = google::protobuf::internal::ExpectTag<10u>((char *)ctx_local), bVar1));
    }
    if (((local_44 & 7) == 4) || (local_44 == 0)) {
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_40->super_EpsCopyInputStream,local_44);
      return (char *)ctx_local;
    }
    this_local = (NBestSentencePieceText *)&(this->super_MessageLite)._internal_metadata_;
    local_18 = (InternalMetadata *)this_local;
    local_10 = (InternalMetadata *)this_local;
    if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         ((InternalMetadata *)this_local);
      local_20 = &pCVar2->unknown_fields;
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<std::__cxx11::string>((InternalMetadata *)this_local);
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,local_20,(char *)ctx_local,pPStack_40);
  } while (ctx_local != (ParseContext *)0x0);
  return (char *)0x0;
}

Assistant:

const char* NBestSentencePieceText::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .sentencepiece.SentencePieceText nbests = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nbests(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}